

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Importer.cpp
# Opt level: O1

aiScene * __thiscall Assimp::Importer::ReadFile(Importer *this,char *_pFile,uint pFlags)

{
  IOSystem *pIVar1;
  ProgressHandler *pPVar2;
  aiString *paVar3;
  _Head_base<0UL,_Assimp::Profiling::Profiler_*,_false> _Var4;
  size_type sVar5;
  uint uVar6;
  ulong uVar7;
  int iVar8;
  Logger *pLVar9;
  Profiler *this_00;
  _Rb_tree_header *p_Var10;
  long lVar11;
  ImporterPimpl *pIVar12;
  undefined4 extraout_var;
  ulong uVar13;
  undefined4 extraout_var_00;
  long *plVar14;
  aiScene *paVar15;
  aiMetadata *paVar16;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar17;
  pointer ppBVar18;
  ulong uVar19;
  BaseImporter *this_01;
  char *pcVar20;
  size_t __n;
  bool bVar21;
  unique_ptr<Assimp::Profiling::Profiler,_std::default_delete<Assimp::Profiling::Profiler>_>
  profiler;
  string ext;
  ScenePreprocessor pre;
  string pFile;
  ValidateDSProcess ds;
  _Head_base<0UL,_Assimp::Profiling::Profiler_*,_false> local_4b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4a8;
  Importer *local_488;
  undefined1 local_480 [36];
  uint local_45c;
  string local_458;
  undefined1 local_438 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_428 [63];
  
  if (this->pimpl == (ImporterPimpl *)0x0) {
    __assert_fail("nullptr != pimpl",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/quantumsheep[P]unicy/libs/assimp/code/Common/Importer.cpp"
                  ,0x233,"const aiScene *Assimp::Importer::ReadFile(const char *, unsigned int)");
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_458,_pFile,(allocator<char> *)local_438);
  WriteLogOpening(&local_458);
  if (this->pimpl->mScene != (aiScene *)0x0) {
    pLVar9 = DefaultLogger::get();
    Logger::debug(pLVar9,"(Deleting previous scene)");
    FreeScene(this);
  }
  pIVar1 = this->pimpl->mIOHandler;
  iVar8 = (*pIVar1->_vptr_IOSystem[2])(pIVar1,local_458._M_dataplus._M_p);
  if ((char)iVar8 == '\0') {
    std::operator+(&local_4a8,"Unable to open file \"",&local_458);
    plVar14 = (long *)std::__cxx11::string::append((char *)&local_4a8);
    paVar17 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(plVar14 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar14 == paVar17) {
      local_428[0]._0_8_ = paVar17->_M_allocated_capacity;
      local_428[0]._8_8_ = plVar14[3];
      local_438._0_8_ = local_428;
    }
    else {
      local_428[0]._0_8_ = paVar17->_M_allocated_capacity;
      local_438._0_8_ =
           (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)*plVar14;
    }
    local_438._8_8_ = plVar14[1];
    *plVar14 = (long)paVar17;
    plVar14[1] = 0;
    *(undefined1 *)(plVar14 + 2) = 0;
    std::__cxx11::string::operator=((string *)&this->pimpl->mErrorString,(string *)local_438);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_438._0_8_ != local_428) {
      operator_delete((void *)local_438._0_8_,local_428[0]._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_4a8._M_dataplus._M_p != &local_4a8.field_2) {
      operator_delete(local_4a8._M_dataplus._M_p,local_4a8.field_2._M_allocated_capacity + 1);
    }
    pLVar9 = DefaultLogger::get();
    Logger::error(pLVar9,(this->pimpl->mErrorString)._M_dataplus._M_p);
    bVar21 = false;
    goto LAB_002f52d4;
  }
  iVar8 = GetPropertyInteger(this,"GLOB_MEASURE_TIME",0);
  if (iVar8 == 0) {
    this_00 = (Profiler *)0x0;
  }
  else {
    this_00 = (Profiler *)operator_new(0x30);
    p_Var10 = &(this_00->regions)._M_t._M_impl.super__Rb_tree_header;
    (this_00->regions)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    (this_00->regions)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    (this_00->regions)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var10->_M_header;
    (this_00->regions)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var10->_M_header;
    (this_00->regions)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  }
  local_4b0._M_head_impl = this_00;
  if (this_00 != (Profiler *)0x0) {
    local_438._0_8_ = local_428;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_438,"total","");
    Profiling::Profiler::BeginRegion(this_00,(string *)local_438);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_438._0_8_ != local_428) {
      operator_delete((void *)local_438._0_8_,local_428[0]._M_allocated_capacity + 1);
    }
  }
  SetPropertyInteger(this,"importerIndex",-1);
  pIVar12 = this->pimpl;
  ppBVar18 = (pIVar12->mImporter).
             super__Vector_base<Assimp::BaseImporter_*,_std::allocator<Assimp::BaseImporter_*>_>.
             _M_impl.super__Vector_impl_data._M_start;
  this_01 = (BaseImporter *)0x0;
  if ((pIVar12->mImporter).
      super__Vector_base<Assimp::BaseImporter_*,_std::allocator<Assimp::BaseImporter_*>_>._M_impl.
      super__Vector_impl_data._M_finish != ppBVar18) {
    uVar13 = 0;
    do {
      iVar8 = (*ppBVar18[uVar13]->_vptr_BaseImporter[3])
                        (ppBVar18[uVar13],&local_458,pIVar12->mIOHandler,0);
      if ((char)iVar8 != '\0') {
        this_01 = (this->pimpl->mImporter).
                  super__Vector_base<Assimp::BaseImporter_*,_std::allocator<Assimp::BaseImporter_*>_>
                  ._M_impl.super__Vector_impl_data._M_start[uVar13];
        SetPropertyInteger(this,"importerIndex",(int)uVar13);
        break;
      }
      uVar13 = (ulong)((int)uVar13 + 1);
      pIVar12 = this->pimpl;
      ppBVar18 = (pIVar12->mImporter).
                 super__Vector_base<Assimp::BaseImporter_*,_std::allocator<Assimp::BaseImporter_*>_>
                 ._M_impl.super__Vector_impl_data._M_start;
    } while (uVar13 < (ulong)((long)(pIVar12->mImporter).
                                    super__Vector_base<Assimp::BaseImporter_*,_std::allocator<Assimp::BaseImporter_*>_>
                                    ._M_impl.super__Vector_impl_data._M_finish - (long)ppBVar18 >> 3
                             ));
  }
  if (this_01 == (BaseImporter *)0x0) {
    lVar11 = std::__cxx11::string::rfind((char)&local_458,0x2e);
    if (lVar11 == -1) {
      this_01 = (BaseImporter *)0x0;
    }
    else {
      pLVar9 = DefaultLogger::get();
      Logger::info(pLVar9,"File extension not known, trying signature-based detection");
      pIVar12 = this->pimpl;
      ppBVar18 = (pIVar12->mImporter).
                 super__Vector_base<Assimp::BaseImporter_*,_std::allocator<Assimp::BaseImporter_*>_>
                 ._M_impl.super__Vector_impl_data._M_start;
      this_01 = (BaseImporter *)0x0;
      if ((pIVar12->mImporter).
          super__Vector_base<Assimp::BaseImporter_*,_std::allocator<Assimp::BaseImporter_*>_>.
          _M_impl.super__Vector_impl_data._M_finish != ppBVar18) {
        uVar13 = 0;
        do {
          iVar8 = (*ppBVar18[uVar13]->_vptr_BaseImporter[3])
                            (ppBVar18[uVar13],&local_458,pIVar12->mIOHandler,1);
          if ((char)iVar8 != '\0') {
            this_01 = (this->pimpl->mImporter).
                      super__Vector_base<Assimp::BaseImporter_*,_std::allocator<Assimp::BaseImporter_*>_>
                      ._M_impl.super__Vector_impl_data._M_start[uVar13];
            SetPropertyInteger(this,"importerIndex",(int)uVar13);
            break;
          }
          uVar13 = (ulong)((int)uVar13 + 1);
          pIVar12 = this->pimpl;
          ppBVar18 = (pIVar12->mImporter).
                     super__Vector_base<Assimp::BaseImporter_*,_std::allocator<Assimp::BaseImporter_*>_>
                     ._M_impl.super__Vector_impl_data._M_start;
        } while (uVar13 < (ulong)((long)(pIVar12->mImporter).
                                        super__Vector_base<Assimp::BaseImporter_*,_std::allocator<Assimp::BaseImporter_*>_>
                                        ._M_impl.super__Vector_impl_data._M_finish - (long)ppBVar18
                                 >> 3));
      }
    }
    if (this_01 != (BaseImporter *)0x0) goto LAB_002f4c0f;
    std::operator+(&local_4a8,"No suitable reader found for the file format of file \"",&local_458);
    plVar14 = (long *)std::__cxx11::string::append((char *)&local_4a8);
    paVar17 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(plVar14 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar14 == paVar17) {
      local_428[0]._0_8_ = paVar17->_M_allocated_capacity;
      local_428[0]._8_8_ = plVar14[3];
      local_438._0_8_ = local_428;
    }
    else {
      local_428[0]._0_8_ = paVar17->_M_allocated_capacity;
      local_438._0_8_ =
           (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)*plVar14;
    }
    local_438._8_8_ = plVar14[1];
    *plVar14 = (long)paVar17;
    plVar14[1] = 0;
    *(undefined1 *)(plVar14 + 2) = 0;
    std::__cxx11::string::operator=((string *)&this->pimpl->mErrorString,(string *)local_438);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_438._0_8_ != local_428) {
      operator_delete((void *)local_438._0_8_,local_428[0]._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_4a8._M_dataplus._M_p != &local_4a8.field_2) {
      operator_delete(local_4a8._M_dataplus._M_p,local_4a8.field_2._M_allocated_capacity + 1);
    }
    pLVar9 = DefaultLogger::get();
    Logger::error(pLVar9,(this->pimpl->mErrorString)._M_dataplus._M_p);
    bVar21 = false;
  }
  else {
LAB_002f4c0f:
    pIVar1 = this->pimpl->mIOHandler;
    local_438._0_8_ = local_428;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_438,"rb","");
    iVar8 = (*pIVar1->_vptr_IOSystem[4])(pIVar1,local_458._M_dataplus._M_p,local_438._0_8_);
    plVar14 = (long *)CONCAT44(extraout_var,iVar8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_438._0_8_ != local_428) {
      operator_delete((void *)local_438._0_8_,local_428[0]._M_allocated_capacity + 1);
    }
    if (plVar14 == (long *)0x0) {
      uVar13 = 0;
    }
    else {
      uVar13 = (**(code **)(*plVar14 + 0x30))(plVar14);
      pIVar1 = this->pimpl->mIOHandler;
      (*pIVar1->_vptr_IOSystem[5])(pIVar1,plVar14);
    }
    iVar8 = (*this_01->_vptr_BaseImporter[5])(this_01);
    local_4a8._M_dataplus._M_p = (pointer)&local_4a8.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_4a8,"unknown","");
    sVar5 = local_4a8._M_string_length;
    if ((undefined8 *)CONCAT44(extraout_var_00,iVar8) != (undefined8 *)0x0) {
      pcVar20 = *(char **)CONCAT44(extraout_var_00,iVar8);
      local_488 = this;
      strlen(pcVar20);
      this = local_488;
      std::__cxx11::string::_M_replace((ulong)&local_4a8,0,(char *)sVar5,(ulong)pcVar20);
    }
    pLVar9 = DefaultLogger::get();
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_480,
                   "Found a matching importer for this file format: ",&local_4a8);
    plVar14 = (long *)std::__cxx11::string::append(local_480);
    paVar17 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(plVar14 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar14 == paVar17) {
      local_428[0]._0_8_ = paVar17->_M_allocated_capacity;
      local_428[0]._8_8_ = plVar14[3];
      local_438._0_8_ = local_428;
    }
    else {
      local_428[0]._0_8_ = paVar17->_M_allocated_capacity;
      local_438._0_8_ =
           (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)*plVar14;
    }
    local_438._8_8_ = plVar14[1];
    *plVar14 = (long)paVar17;
    plVar14[1] = 0;
    *(undefined1 *)(plVar14 + 2) = 0;
    Logger::info(pLVar9,(char *)local_438._0_8_);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_438._0_8_ != local_428) {
      operator_delete((void *)local_438._0_8_,local_428[0]._M_allocated_capacity + 1);
    }
    if ((aiScene *)local_480._0_8_ != (aiScene *)(local_480 + 0x10)) {
      operator_delete((void *)local_480._0_8_,local_480._16_8_ + 1);
    }
    pPVar2 = this->pimpl->mProgressHandler;
    (*pPVar2->_vptr_ProgressHandler[3])(pPVar2,0,uVar13 & 0xffffffff);
    _Var4._M_head_impl = local_4b0._M_head_impl;
    if (local_4b0._M_head_impl != (Profiler *)0x0) {
      local_438._0_8_ = local_428;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_438,"import","");
      Profiling::Profiler::BeginRegion(_Var4._M_head_impl,(string *)local_438);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_438._0_8_ != local_428) {
        operator_delete((void *)local_438._0_8_,local_428[0]._M_allocated_capacity + 1);
      }
    }
    paVar15 = BaseImporter::ReadFile(this_01,this,&local_458,this->pimpl->mIOHandler);
    this->pimpl->mScene = paVar15;
    pPVar2 = this->pimpl->mProgressHandler;
    (*pPVar2->_vptr_ProgressHandler[3])(pPVar2,uVar13 & 0xffffffff,uVar13 & 0xffffffff);
    _Var4._M_head_impl = local_4b0._M_head_impl;
    if (local_4b0._M_head_impl != (Profiler *)0x0) {
      local_438._0_8_ = local_428;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_438,"import","");
      Profiling::Profiler::EndRegion(_Var4._M_head_impl,(string *)local_438);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_438._0_8_ != local_428) {
        operator_delete((void *)local_438._0_8_,local_428[0]._M_allocated_capacity + 1);
      }
    }
    SetPropertyString(this,"sourceFilePath",&local_458);
    pIVar12 = this->pimpl;
    if (pIVar12->mScene == (aiScene *)0x0) {
      std::__cxx11::string::_M_assign((string *)&pIVar12->mErrorString);
LAB_002f5164:
      SharedPostProcessInfo::Clean(this->pimpl->mPPShared);
      _Var4._M_head_impl = local_4b0._M_head_impl;
      bVar21 = true;
      if (local_4b0._M_head_impl != (Profiler *)0x0) {
        local_438._0_8_ = local_428;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_438,"total","");
        Profiling::Profiler::EndRegion(_Var4._M_head_impl,(string *)local_438);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_438._0_8_ != local_428) {
          operator_delete((void *)local_438._0_8_,local_428[0]._M_allocated_capacity + 1);
        }
      }
    }
    else {
      paVar16 = pIVar12->mScene->mMetaData;
      local_45c = pFlags;
      if (paVar16 == (aiMetadata *)0x0) {
LAB_002f4f7e:
        paVar16 = (aiMetadata *)operator_new(0x18);
        paVar16->mNumProperties = 0;
        paVar16->mKeys = (aiString *)0x0;
        paVar16->mValues = (aiMetadataEntry *)0x0;
        pIVar12->mScene->mMetaData = paVar16;
LAB_002f4f9d:
        paVar16 = this->pimpl->mScene->mMetaData;
        local_480._0_8_ = local_480 + 0x10;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_480,"SourceAsset_Format","")
        ;
        __n = 0x3ff;
        if ((local_4a8._M_string_length & 0xfffffc00) == 0) {
          __n = local_4a8._M_string_length & 0xffffffff;
        }
        local_438._0_4_ = (int)__n;
        memcpy(local_438 + 4,local_4a8._M_dataplus._M_p,__n);
        local_438[__n + 4] = 0;
        aiMetadata::Add<aiString>(paVar16,(string *)local_480,(aiString *)local_438);
        if ((aiScene *)local_480._0_8_ != (aiScene *)(local_480 + 0x10)) {
          operator_delete((void *)local_480._0_8_,local_480._16_8_ + 1);
        }
      }
      else {
        uVar13 = (ulong)paVar16->mNumProperties;
        bVar21 = uVar13 != 0;
        if (uVar13 == 0) {
LAB_002f4f71:
          if (!bVar21) {
            if (paVar16 == (aiMetadata *)0x0) goto LAB_002f4f7e;
            goto LAB_002f4f9d;
          }
        }
        else {
          paVar3 = paVar16->mKeys;
          iVar8 = strncmp(paVar3->data,"SourceAsset_Format",(ulong)paVar3->length);
          if (iVar8 != 0) {
            pcVar20 = paVar3[1].data;
            uVar7 = 1;
            local_488 = this;
            do {
              uVar19 = uVar7;
              if (uVar13 == uVar19) break;
              iVar8 = strncmp(pcVar20,"SourceAsset_Format",
                              (ulong)((aiString *)(pcVar20 + -4))->length);
              pcVar20 = pcVar20 + 0x404;
              uVar7 = uVar19 + 1;
            } while (iVar8 != 0);
            bVar21 = uVar19 < uVar13;
            this = local_488;
            goto LAB_002f4f71;
          }
        }
      }
      uVar6 = local_45c;
      if ((local_45c >> 10 & 1) == 0) {
LAB_002f5081:
        _Var4._M_head_impl = local_4b0._M_head_impl;
        if (local_4b0._M_head_impl != (Profiler *)0x0) {
          local_438._0_8_ = local_428;
          std::__cxx11::string::_M_construct<char_const*>((string *)local_438,"preprocess","");
          Profiling::Profiler::BeginRegion(_Var4._M_head_impl,(string *)local_438);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_438._0_8_ != local_428) {
            operator_delete((void *)local_438._0_8_,local_428[0]._M_allocated_capacity + 1);
          }
        }
        local_480._0_8_ = this->pimpl->mScene;
        ScenePreprocessor::ProcessScene((ScenePreprocessor *)local_480);
        _Var4._M_head_impl = local_4b0._M_head_impl;
        if (local_4b0._M_head_impl != (Profiler *)0x0) {
          local_438._0_8_ = local_428;
          std::__cxx11::string::_M_construct<char_const*>((string *)local_438,"preprocess","");
          Profiling::Profiler::EndRegion(_Var4._M_head_impl,(string *)local_438);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_438._0_8_ != local_428) {
            operator_delete((void *)local_438._0_8_,local_428[0]._M_allocated_capacity + 1);
          }
        }
        ApplyPostProcessing(this,uVar6 & 0xfffffbff);
        goto LAB_002f5164;
      }
      ValidateDSProcess::ValidateDSProcess((ValidateDSProcess *)local_438);
      BaseProcess::ExecuteOnScene((BaseProcess *)local_438,this);
      paVar15 = this->pimpl->mScene;
      ValidateDSProcess::~ValidateDSProcess((ValidateDSProcess *)local_438);
      if (paVar15 != (aiScene *)0x0) goto LAB_002f5081;
      bVar21 = false;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_4a8._M_dataplus._M_p != &local_4a8.field_2) {
      operator_delete(local_4a8._M_dataplus._M_p,local_4a8.field_2._M_allocated_capacity + 1);
    }
  }
  std::unique_ptr<Assimp::Profiling::Profiler,_std::default_delete<Assimp::Profiling::Profiler>_>::
  ~unique_ptr((unique_ptr<Assimp::Profiling::Profiler,_std::default_delete<Assimp::Profiling::Profiler>_>
               *)&local_4b0);
LAB_002f52d4:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_458._M_dataplus._M_p != &local_458.field_2) {
    operator_delete(local_458._M_dataplus._M_p,local_458.field_2._M_allocated_capacity + 1);
  }
  if (bVar21) {
    paVar15 = this->pimpl->mScene;
  }
  else {
    paVar15 = (aiScene *)0x0;
  }
  return paVar15;
}

Assistant:

const aiScene* Importer::ReadFile( const char* _pFile, unsigned int pFlags) {
    ai_assert(nullptr != pimpl);
    
    ASSIMP_BEGIN_EXCEPTION_REGION();
    const std::string pFile(_pFile);

    // ----------------------------------------------------------------------
    // Put a large try block around everything to catch all std::exception's
    // that might be thrown by STL containers or by new().
    // ImportErrorException's are throw by ourselves and caught elsewhere.
    //-----------------------------------------------------------------------

    WriteLogOpening(pFile);

#ifdef ASSIMP_CATCH_GLOBAL_EXCEPTIONS
    try
#endif // ! ASSIMP_CATCH_GLOBAL_EXCEPTIONS
    {
        // Check whether this Importer instance has already loaded
        // a scene. In this case we need to delete the old one
        if (pimpl->mScene)  {

            ASSIMP_LOG_DEBUG("(Deleting previous scene)");
            FreeScene();
        }

        // First check if the file is accessible at all
        if( !pimpl->mIOHandler->Exists( pFile)) {

            pimpl->mErrorString = "Unable to open file \"" + pFile + "\".";
            ASSIMP_LOG_ERROR(pimpl->mErrorString);
            return nullptr;
        }

        std::unique_ptr<Profiler> profiler(GetPropertyInteger(AI_CONFIG_GLOB_MEASURE_TIME,0)?new Profiler():NULL);
        if (profiler) {
            profiler->BeginRegion("total");
        }

        // Find an worker class which can handle the file
        BaseImporter* imp = nullptr;
        SetPropertyInteger("importerIndex", -1);
        for( unsigned int a = 0; a < pimpl->mImporter.size(); a++)  {

            if( pimpl->mImporter[a]->CanRead( pFile, pimpl->mIOHandler, false)) {
                imp = pimpl->mImporter[a];
                SetPropertyInteger("importerIndex", a);
                break;
            }
        }

        if (!imp)   {
            // not so bad yet ... try format auto detection.
            const std::string::size_type s = pFile.find_last_of('.');
            if (s != std::string::npos) {
                ASSIMP_LOG_INFO("File extension not known, trying signature-based detection");
                for( unsigned int a = 0; a < pimpl->mImporter.size(); a++)  {
                    if( pimpl->mImporter[a]->CanRead( pFile, pimpl->mIOHandler, true)) {
                        imp = pimpl->mImporter[a];
                        SetPropertyInteger("importerIndex", a);
                        break;
                    }
                }
            }
            // Put a proper error message if no suitable importer was found
            if( !imp)   {
                pimpl->mErrorString = "No suitable reader found for the file format of file \"" + pFile + "\".";
                ASSIMP_LOG_ERROR(pimpl->mErrorString);
                return nullptr;
            }
        }

        // Get file size for progress handler
        IOStream * fileIO = pimpl->mIOHandler->Open( pFile );
        uint32_t fileSize = 0;
        if (fileIO)
        {
            fileSize = static_cast<uint32_t>(fileIO->FileSize());
            pimpl->mIOHandler->Close( fileIO );
        }

        // Dispatch the reading to the worker class for this format
        const aiImporterDesc *desc( imp->GetInfo() );
        std::string ext( "unknown" );
        if ( nullptr != desc ) {
            ext = desc->mName;
        }
        ASSIMP_LOG_INFO("Found a matching importer for this file format: " + ext + "." );
        pimpl->mProgressHandler->UpdateFileRead( 0, fileSize );

        if (profiler) {
            profiler->BeginRegion("import");
        }

        pimpl->mScene = imp->ReadFile( this, pFile, pimpl->mIOHandler);
        pimpl->mProgressHandler->UpdateFileRead( fileSize, fileSize );

        if (profiler) {
            profiler->EndRegion("import");
        }

        SetPropertyString("sourceFilePath", pFile);

        // If successful, apply all active post processing steps to the imported data
        if( pimpl->mScene)  {
            if (!pimpl->mScene->mMetaData || !pimpl->mScene->mMetaData->HasKey(AI_METADATA_SOURCE_FORMAT)) {
                if (!pimpl->mScene->mMetaData) {
                    pimpl->mScene->mMetaData = new aiMetadata;
                }
                pimpl->mScene->mMetaData->Add(AI_METADATA_SOURCE_FORMAT, aiString(ext));
            }

#ifndef ASSIMP_BUILD_NO_VALIDATEDS_PROCESS
            // The ValidateDS process is an exception. It is executed first, even before ScenePreprocessor is called.
            if (pFlags & aiProcess_ValidateDataStructure) {
                ValidateDSProcess ds;
                ds.ExecuteOnScene (this);
                if (!pimpl->mScene) {
                    return nullptr;
                }
            }
#endif // no validation

            // Preprocess the scene and prepare it for post-processing
            if (profiler) {
                profiler->BeginRegion("preprocess");
            }

            ScenePreprocessor pre(pimpl->mScene);
            pre.ProcessScene();

            if (profiler) {
                profiler->EndRegion("preprocess");
            }

            // Ensure that the validation process won't be called twice
            ApplyPostProcessing(pFlags & (~aiProcess_ValidateDataStructure));
        }
        // if failed, extract the error string
        else if( !pimpl->mScene) {
            pimpl->mErrorString = imp->GetErrorText();
        }

        // clear any data allocated by post-process steps
        pimpl->mPPShared->Clean();

        if (profiler) {
            profiler->EndRegion("total");
        }
    }
#ifdef ASSIMP_CATCH_GLOBAL_EXCEPTIONS
    catch (std::exception &e) {
#if (defined _MSC_VER) &&   (defined _CPPRTTI)
        // if we have RTTI get the full name of the exception that occurred
        pimpl->mErrorString = std::string(typeid( e ).name()) + ": " + e.what();
#else
        pimpl->mErrorString = std::string("std::exception: ") + e.what();
#endif

        ASSIMP_LOG_ERROR(pimpl->mErrorString);
        delete pimpl->mScene; pimpl->mScene = nullptr;
    }
#endif // ! ASSIMP_CATCH_GLOBAL_EXCEPTIONS

    // either successful or failure - the pointer expresses it anyways
    ASSIMP_END_EXCEPTION_REGION_WITH_ERROR_STRING(const aiScene*, pimpl->mErrorString);
    
    return pimpl->mScene;
}